

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O2

bool __thiscall bssl::ssl_is_valid_ech_public_name(bssl *this,Span<const_unsigned_char> public_name)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uchar *puVar4;
  ulong uVar5;
  Span<const_unsigned_char> *__range2;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  Span<const_unsigned_char> SVar9;
  Span<const_unsigned_char> local_58;
  Span<const_unsigned_char> local_48;
  uchar *local_38;
  
  local_48.size_ = (size_t)public_name.data_;
  local_48.data_ = (uchar *)this;
  if ((uchar *)local_48.size_ == (uchar *)0x0) {
    return false;
  }
  local_38 = (uchar *)0x0;
  uVar8 = 0;
  puVar4 = (uchar *)local_48.size_;
  while (puVar4 != (uchar *)0x0) {
    local_58.data_._0_1_ = 0x2e;
    puVar4 = std::__find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (local_48.data_,puVar4 + (long)local_48.data_,&local_58);
    local_58 = (Span<const_unsigned_char>)ZEXT816(0);
    sVar6 = local_48.size_;
    if (puVar4 == local_48.data_ + local_48.size_) {
      local_58 = local_48;
      local_38 = local_48.data_;
      local_48 = (Span<const_unsigned_char>)ZEXT816(0);
      uVar8 = sVar6;
    }
    else {
      local_58 = Span<const_unsigned_char>::subspan(&local_48,0,(long)puVar4 - (long)local_48.data_)
      ;
      local_48 = Span<const_unsigned_char>::subspan
                           (&local_48,(size_t)(puVar4 + (1 - (long)local_48.data_)),
                            0xffffffffffffffff);
      if (local_48.size_ == 0) {
        return false;
      }
      sVar6 = local_58.size_;
    }
    if (sVar6 - 0x40 < 0xffffffffffffffc1) {
      return false;
    }
    puVar4 = Span<const_unsigned_char>::front(&local_58);
    if (*puVar4 == '-') {
      return false;
    }
    puVar4 = Span<const_unsigned_char>::back(&local_58);
    if (*puVar4 == '-') {
      return false;
    }
    puVar4 = local_58.data_;
    sVar6 = local_58.size_;
    sVar7 = 0;
    while (sVar6 != sVar7) {
      bVar1 = puVar4[sVar7];
      iVar3 = OPENSSL_isalnum((uint)bVar1);
      sVar7 = sVar7 + 1;
      if ((bVar1 != 0x2d) && (iVar3 == 0)) {
        return false;
      }
    }
    puVar4 = (uchar *)local_48.size_;
  }
  local_58.size_ = uVar8;
  local_58.data_ = local_38;
  if (1 < uVar8) {
    if ((*local_38 != '0') || ((local_38[1] | 0x20) != 0x78)) goto LAB_00208125;
    SVar9 = Span<const_unsigned_char>::subspan(&local_58,2,0xffffffffffffffff);
    sVar6 = 0;
    do {
      if (SVar9.size_ == sVar6) {
        return false;
      }
      iVar3 = OPENSSL_isxdigit((uint)SVar9.data_[sVar6]);
      sVar6 = sVar6 + 1;
    } while (iVar3 != 0);
  }
  if (uVar8 == 0) {
    return true;
  }
LAB_00208125:
  uVar5 = 0;
  do {
    bVar2 = uVar8 != uVar5;
    if (uVar8 == uVar5) {
      return bVar2;
    }
    puVar4 = local_38 + uVar5;
    uVar5 = uVar5 + 1;
  } while ((byte)(*puVar4 - 0x30) < 10);
  return bVar2;
}

Assistant:

bool ssl_is_valid_ech_public_name(Span<const uint8_t> public_name) {
  // See draft-ietf-tls-esni-13, Section 4 and RFC 5890, Section 2.3.1. The
  // public name must be a dot-separated sequence of LDH labels and not begin or
  // end with a dot.
  auto remaining = public_name;
  if (remaining.empty()) {
    return false;
  }
  Span<const uint8_t> last;
  while (!remaining.empty()) {
    // Find the next dot-separated component.
    auto dot = std::find(remaining.begin(), remaining.end(), '.');
    Span<const uint8_t> component;
    if (dot == remaining.end()) {
      component = remaining;
      last = component;
      remaining = Span<const uint8_t>();
    } else {
      component = remaining.subspan(0, dot - remaining.begin());
      // Skip the dot.
      remaining = remaining.subspan(dot - remaining.begin() + 1);
      if (remaining.empty()) {
        // Trailing dots are not allowed.
        return false;
      }
    }
    // |component| must be a valid LDH label. Checking for empty components also
    // rejects leading dots.
    if (component.empty() || component.size() > 63 ||
        component.front() == '-' || component.back() == '-') {
      return false;
    }
    for (uint8_t c : component) {
      if (!OPENSSL_isalnum(c) && c != '-') {
        return false;
      }
    }
  }

  // The WHATWG URL parser additionally does not allow any DNS names that end in
  // a numeric component. See:
  // https://url.spec.whatwg.org/#concept-host-parser
  // https://url.spec.whatwg.org/#ends-in-a-number-checker
  //
  // The WHATWG parser is formulated in terms of parsing decimal, octal, and
  // hex, along with a separate ASCII digits check. The ASCII digits check
  // subsumes the decimal and octal check, so we only need to check two cases.
  return !is_hex_component(last) && !is_decimal_component(last);
}